

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eddsa.c
# Opt level: O3

_Bool i2p_eddsa_verify(uint8_t *pubkey,uint8_t *buf,size_t sz,uint8_t *sig)

{
  int iVar1;
  _Bool _Var2;
  uchar rcheck [32];
  uchar h [64];
  ge_p3 A;
  SHA512_CTX sha;
  ge_p2 R;
  uchar auStack_278 [32];
  uchar local_258 [64];
  ge_p3 local_218;
  SHA512_CTX local_178;
  ge_p2 local_a0;
  
  SHA512_Init(&local_178);
  iVar1 = crypto_sign_ed25519_ref10_ge_frombytes_negate_vartime(&local_218,pubkey);
  if (iVar1 == 0) {
    SHA512_Update(&local_178,sig,0x20);
    SHA512_Update(&local_178,pubkey,0x20);
    SHA512_Update(&local_178,buf,sz);
    SHA512_Final(local_258,&local_178);
    crypto_sign_ed25519_ref10_sc_reduce(local_258);
    crypto_sign_ed25519_ref10_ge_double_scalarmult_vartime
              (&local_a0,local_258,&local_218,sig + 0x20);
    crypto_sign_ed25519_ref10_ge_tobytes(auStack_278,&local_a0);
    iVar1 = crypto_verify_32(auStack_278,sig);
    _Var2 = iVar1 == 0;
  }
  else {
    _Var2 = false;
  }
  return _Var2;
}

Assistant:

bool i2p_eddsa_verify(const uint8_t * pubkey, const uint8_t * buf, size_t sz, const uint8_t * sig) {

  unsigned char h[64];
  unsigned char rcheck[32];
  ge_p3 A;
  ge_p2 R;
  SHA512_CTX sha;
  SHA512_Init(&sha);

  if (ge_frombytes_negate_vartime(&A,pubkey) != 0)
  {
    return false;
  }
 
  SHA512_Update(&sha,sig,32);
  SHA512_Update(&sha,pubkey, 32);
  SHA512_Update(&sha,buf,sz);
  SHA512_Final(h, &sha);
  sc_reduce(h);

  ge_double_scalarmult_vartime(&R,h,&A,sig + 32);
  ge_tobytes(rcheck,&R);
  return crypto_verify_32(rcheck, sig) == 0;
}